

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O3

void __thiscall QtMWidgets::MessageBoxPrivate::adjustSize(MessageBoxPrivate *this)

{
  long lVar1;
  QArrayData *pQVar2;
  QAbstractButton **ppQVar3;
  int extraout_EAX;
  int iVar4;
  int iVar5;
  int iVar6;
  int width;
  int iVar7;
  long lVar8;
  double dVar9;
  QSize s;
  int local_48;
  
  QGuiApplication::primaryScreen();
  QScreen::availableSize();
  lVar1 = *(long *)&this->q->field_0x20;
  iVar5 = (*(int *)(lVar1 + 0x1c) - *(int *)(lVar1 + 0x14)) + 1;
  iVar6 = (*(int *)(lVar1 + 0x20) - *(int *)(lVar1 + 0x18)) + 1;
  QGuiApplication::primaryScreen();
  QScreen::availableGeometry();
  local_48 = extraout_EAX;
  if (this->window != (QWidget *)0x0) {
    lVar1 = *(long *)(this->window + 0x20);
    local_48 = ((int)*(undefined8 *)(lVar1 + 0x1c) - (int)*(undefined8 *)(lVar1 + 0x14)) + 1;
  }
  pQVar2 = &((this->buttons).d.d)->super_QArrayData;
  ppQVar3 = (this->buttons).d.ptr;
  lVar1 = (this->buttons).d.size;
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (lVar1 == 0) {
    iVar7 = 0;
  }
  else {
    lVar8 = 0;
    iVar7 = 0;
    do {
      iVar4 = (**(code **)(**(long **)((long)ppQVar3 + lVar8) + 0x70))();
      iVar7 = iVar7 + iVar4;
      lVar8 = lVar8 + 8;
    } while (lVar1 << 3 != lVar8);
  }
  if (pQVar2 != (QArrayData *)0x0) {
    LOCK();
    (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(pQVar2,8,8);
    }
  }
  if (iVar5 < iVar7) {
    iVar6 = (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,iVar7);
    lVar1 = *(long *)&this->title->field_0x20;
    lVar8 = *(long *)&this->okButton->field_0x20;
    iVar6 = ((iVar6 + *(int *)(lVar1 + 0x20) + *(int *)(lVar8 + 0x20) +
              *(int *)(*(long *)(this->h1 + 0x20) + 0x20) +
             *(int *)(*(long *)(this->h2 + 0x20) + 0x20)) -
            (*(int *)(lVar1 + 0x18) + *(int *)(lVar8 + 0x18) +
             *(int *)(*(long *)(this->h1 + 0x20) + 0x18) +
            *(int *)(*(long *)(this->h2 + 0x20) + 0x18))) + 4;
    iVar5 = iVar7;
  }
  dVar9 = (double)iVar6 / (double)iVar5;
  if (1.5 < dVar9) {
    dVar9 = dVar9 * (double)iVar5;
    iVar5 = (int)((double)((ulong)dVar9 & 0x8000000000000000 | (ulong)DAT_0017b2f0) + dVar9);
    (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,iVar5);
  }
  local_48 = local_48 + this->screenMargin * -2;
  if (local_48 < iVar5) {
    (**(code **)(*(long *)this->textLabel + 0x80))(this->textLabel,local_48);
  }
  QWidget::resize((QSize *)this->q);
  if ((QPoint *)this->window != (QPoint *)0x0) {
    QWidget::mapToGlobal((QPoint *)this->window);
  }
  QWidget::move((QPoint *)this->q);
  QLayout::update();
  return;
}

Assistant:

void
MessageBoxPrivate::adjustSize()
{
	QSize ws = QApplication::primaryScreen()->availableSize();
	QSize s = q->size();
	QRect wr = QApplication::primaryScreen()->availableGeometry();

	if( window )
	{
		ws = window->size();
		wr = window->rect();
	}

	{
		int width = 0;

		foreach( QAbstractButton * btn, buttons )
			width += btn->sizeHint().width();

		if( width > s.width() )
			s = QSize( width,
					textLabel->heightForWidth( width ) + title->height() +
						okButton->height() + h1->height() + h2->height() );
	}

	qreal factor = (qreal) s.height() / (qreal) s.width();

	if( factor > 1.5 )
	{
		const int width = qRound( (qreal) s.width() * factor );

		s = QSize( width,
				textLabel->heightForWidth( width ) + title->height() +
					okButton->height() + h1->height() + h2->height() );
	}

	if( s.width() > ws.width() - screenMargin * 2 )
	{
		const int width = ws.width() - screenMargin * 2;

		s = QSize( width,
			textLabel->heightForWidth( width ) + title->height() +
				okButton->height() + h1->height() + h2->height() );
	}

	if( s.height() > ws.height() - screenMargin * 2 )
		s = QSize( s.width(), ws.height() - screenMargin * 2 );


	q->resize( s );

	QPoint p = QPoint( wr.x() + ( ws.width() - s.width() ) / 2,
		wr.y() + ( ws.height() - s.height() ) / 2 );

	if( window )
		p = window->mapToGlobal( p );

	q->move( p );

	vbox->update();
}